

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::~TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,void **vtt)

{
  void *pvVar1;
  TPZCompEl *this_00;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  TPZGeoEl *pTVar5;
  TPZConnect *pTVar6;
  TPZGeoEl *pTVar7;
  long *plVar8;
  int64_t iVar9;
  int side;
  long lVar10;
  bool bVar11;
  TPZGeoElSide gelside;
  TPZCompElSide largecel;
  TPZStack<TPZCompElSide,_10> celstack;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)(&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
              super_TPZInterpolationSpace.super_TPZCompEl.field_0x0 +
            *(long *)((long)pvVar1 + -0x60)) = vtt[9];
  pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
  if ((pTVar5 == (TPZGeoEl *)0x0) ||
     ((TPZCompElHDiv<pzshape::TPZShapePrism> *)pTVar5->fReference == this)) {
    for (side = 6; side != 0x15; side = side + 1) {
      iVar2 = pztopology::TPZPrism::SideDimension(side);
      if (iVar2 == 2) {
        gelside.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
        gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
        gelside.fSide = side;
        TPZStack<TPZCompElSide,_10>::TPZStack(&celstack);
        TPZGeoElSide::LowerLevelCompElementList2((TPZGeoElSide *)&largecel,(int)&gelside);
        if (largecel.fEl != (TPZCompEl *)0x0) {
          uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0x250))(this,0,side);
          pTVar6 = (TPZConnect *)
                   (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xa8))(this,uVar3);
          TPZConnect::RemoveDepend(pTVar6);
        }
        if (gelside.fGeoEl != (TPZGeoEl *)0x0) {
          TPZGeoElSide::HigherLevelCompElementList3(&gelside,&celstack,0,1);
        }
        iVar9 = celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                fNElements;
        if (celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements <
            1) {
          iVar9 = 0;
        }
        lVar10 = 8;
        while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
          this_00 = *(TPZCompEl **)
                     ((long)celstack.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore + lVar10 + -8);
          uVar3 = *(undefined4 *)
                   ((long)&(celstack.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar10);
          pTVar7 = TPZCompEl::Reference(this_00);
          iVar2 = (**(code **)(*(long *)pTVar7 + 0x208))(pTVar7,uVar3);
          iVar4 = (**(code **)(*(long *)pTVar5 + 0x210))(pTVar5);
          if (iVar2 == iVar4 + -1) {
            plVar8 = (long *)__dynamic_cast(this_00,&TPZCompEl::typeinfo,
                                            &TPZInterpolatedElement::typeinfo,0);
            if (plVar8 == (long *)0x0) {
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                         ,0xc0);
            }
            uVar3 = (**(code **)(*plVar8 + 0x250))(plVar8,0,uVar3);
            pTVar6 = (TPZConnect *)(**(code **)(*plVar8 + 0xa8))(plVar8,uVar3);
            TPZConnect::RemoveDepend(pTVar6);
          }
          lVar10 = lVar10 + 0x10;
        }
        TPZManVector<TPZCompElSide,_10>::~TPZManVector
                  (&celstack.super_TPZManVector<TPZCompElSide,_10>);
      }
    }
    if (pTVar5 != (TPZGeoEl *)0x0) {
      pTVar5->fReference = (TPZCompEl *)0x0;
    }
  }
  TPZManVector<long,_6>::~TPZManVector(&this->fConnectIndexes);
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&(this->fRestraints).
              super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>);
  TPZManVector<int,_5>::~TPZManVector(&this->fSideOrient);
  TPZIntelGen<pzshape::TPZShapePrism>::~TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePrism>,vtt + 1);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::~TPZCompElHDiv(){
    TPZGeoEl *gel = this->Reference();
    if (gel && gel->Reference() != this) {
        return;
    }
    for (int side=TSHAPE::NCornerNodes; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension-1) {
            continue;
        }
        TPZGeoElSide gelside(this->Reference(),side);
        TPZStack<TPZCompElSide> celstack;
        TPZCompElSide largecel = gelside.LowerLevelCompElementList2(0);
        if (largecel) {
            int cindex = SideConnectLocId(0, side);
            TPZConnect &c = this->Connect(cindex);
            c.RemoveDepend();
        }
        if (gelside.Element()){
            gelside.HigherLevelCompElementList3(celstack, 0, 1);
        }
        int64_t ncel = celstack.size();
        for (int64_t el=0; el<ncel; el++) {
            TPZCompElSide celside = celstack[el];
            TPZCompEl *celsmall = celside.Element();
            TPZGeoEl *gelsmall = celsmall->Reference();
            if (gelsmall->SideDimension(celside.Side()) != gel->Dimension()-1) {
                continue;
            }
            TPZInterpolatedElement *intelsmall = dynamic_cast<TPZInterpolatedElement *>(celsmall);
            if (!intelsmall) {
                DebugStop();
            }
            int cindex = intelsmall->SideConnectLocId(0, celside.Side());
            TPZConnect &c = intelsmall->Connect(cindex);
            c.RemoveDepend();
        }
    }
    if (gel){
        gel->ResetReference();
    }
}